

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cliloop.c
# Opt level: O1

void cli_main_loop(cliloop_pw_setup_t pw_setup,cliloop_pw_check_t pw_check,cliloop_continue_t cont,
                  void *ctx)

{
  int fd;
  _Bool _Var1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  pollwrapper *pw;
  void *pvVar5;
  unsigned_long uVar6;
  unsigned_long uVar7;
  int *piVar8;
  size_t oldlen;
  long lVar9;
  long lVar10;
  long lVar11;
  int rwx;
  int fdstate;
  unsigned_long next;
  size_t fdsize;
  int local_78;
  int local_74;
  unsigned_long local_70;
  void *local_68;
  cliloop_pw_setup_t local_60;
  unsigned_long local_58;
  cliloop_pw_check_t local_50;
  cliloop_continue_t local_48;
  void *local_40;
  size_t local_38;
  
  local_50 = pw_check;
  local_48 = cont;
  local_70 = getticks();
  local_38 = 0;
  pvVar5 = (void *)0x0;
  pw = pollwrap_new();
  local_60 = pw_setup;
  local_40 = ctx;
  do {
    pollwrap_clear(pw);
    _Var1 = (*pw_setup)(ctx,pw);
    bVar2 = true;
    if (_Var1) {
      iVar3 = first_fd(&local_74,&local_78);
      oldlen = 0;
      while (-1 < iVar3) {
        oldlen = oldlen + 1;
        iVar3 = next_fd(&local_74,&local_78);
      }
      pvVar5 = safegrowarray(pvVar5,&local_38,4,oldlen,1,false);
      iVar3 = first_fd(&local_74,&local_78);
      lVar11 = 0;
      while (-1 < iVar3) {
        *(int *)((long)pvVar5 + lVar11 * 4) = iVar3;
        lVar11 = lVar11 + 1;
        pollwrap_add_fd_rwx(pw,iVar3,local_78);
        iVar3 = next_fd(&local_74,&local_78);
      }
      _Var1 = toplevel_callback_pending();
      uVar7 = local_70;
      local_68 = pvVar5;
      if (_Var1) {
        iVar3 = pollwrap_poll_instant(pw);
        uVar7 = local_70;
      }
      else {
        _Var1 = run_timers(local_70,&local_58);
        if (_Var1) {
          do {
            uVar6 = getticks();
            lVar9 = 0;
            if (uVar6 - uVar7 <= local_58 - uVar7) {
              lVar9 = local_58 - uVar6;
            }
            lVar10 = lVar9;
            if (0x7ffffffe < lVar9) {
              lVar10 = 0x7fffffff;
            }
            iVar3 = pollwrap_poll_timeout(pw,(int)lVar10);
            uVar7 = local_58;
            if (iVar3 != 0 || 0x7fffffff < lVar9) {
              uVar7 = getticks();
            }
          } while ((iVar3 < 0) && (piVar8 = __errno_location(), *piVar8 == 4));
        }
        else {
          iVar3 = pollwrap_poll_endless(pw);
        }
      }
      local_70 = uVar7;
      if (iVar3 < 0) {
        piVar8 = __errno_location();
        if (*piVar8 != 4) {
          cli_main_loop_cold_1();
          return;
        }
        bVar2 = false;
        pvVar5 = local_68;
        pw_setup = local_60;
      }
      else {
        if (lVar11 != 0) {
          lVar9 = 0;
          do {
            fd = *(int *)((long)local_68 + lVar9 * 4);
            uVar4 = pollwrap_get_fd_rwx(pw,fd);
            if ((uVar4 & 4) != 0) {
              select_result(fd,4);
            }
            if ((uVar4 & 1) != 0) {
              select_result(fd,1);
            }
            if ((uVar4 & 2) != 0) {
              select_result(fd,2);
            }
            lVar9 = lVar9 + 1;
          } while (lVar11 != lVar9);
        }
        ctx = local_40;
        (*local_50)(local_40,pw);
        _Var1 = run_toplevel_callbacks();
        _Var1 = (*local_48)(ctx,iVar3 != 0,_Var1);
        bVar2 = !_Var1;
        pvVar5 = local_68;
        pw_setup = local_60;
      }
    }
  } while (!bVar2);
  pollwrap_free(pw);
  safefree(pvVar5);
  return;
}

Assistant:

void cli_main_loop(cliloop_pw_setup_t pw_setup,
                   cliloop_pw_check_t pw_check,
                   cliloop_continue_t cont, void *ctx)
{
    unsigned long now = GETTICKCOUNT();

    int *fdlist = NULL;
    size_t fdsize = 0;

    pollwrapper *pw = pollwrap_new();

    while (true) {
        int rwx;
        int ret;
        int fdstate;
        unsigned long next;

        pollwrap_clear(pw);

        if (!pw_setup(ctx, pw))
            break; /* our client signalled emergency exit */

        /* Count the currently active fds. */
        size_t nfds = 0;
        for (int fd = first_fd(&fdstate, &rwx); fd >= 0;
             fd = next_fd(&fdstate, &rwx))
            nfds++;

        /* Expand the fdlist buffer if necessary. */
        sgrowarray(fdlist, fdsize, nfds);

        /*
         * Add all currently open uxsel fds to pw, and store them in
         * fdlist as well.
         */
        size_t fdcount = 0;
        for (int fd = first_fd(&fdstate, &rwx); fd >= 0;
             fd = next_fd(&fdstate, &rwx)) {
            fdlist[fdcount++] = fd;
            pollwrap_add_fd_rwx(pw, fd, rwx);
        }

        if (toplevel_callback_pending()) {
            ret = pollwrap_poll_instant(pw);
        } else if (run_timers(now, &next)) {
            do {
                unsigned long then;
                long ticks;

                then = now;
                now = GETTICKCOUNT();
                if (now - then > next - then)
                    ticks = 0;
                else
                    ticks = next - now;

                bool overflow = false;
                if (ticks > INT_MAX) {
                    ticks = INT_MAX;
                    overflow = true;
                }

                ret = pollwrap_poll_timeout(pw, ticks);
                if (ret == 0 && !overflow)
                    now = next;
                else
                    now = GETTICKCOUNT();
            } while (ret < 0 && errno == EINTR);
        } else {
            ret = pollwrap_poll_endless(pw);
        }

        if (ret < 0 && errno == EINTR)
            continue;

        if (ret < 0) {
            perror("poll");
            exit(1);
        }

        bool found_fd = (ret > 0);

        for (size_t i = 0; i < fdcount; i++) {
            int fd = fdlist[i];
            int rwx = pollwrap_get_fd_rwx(pw, fd);
            /*
             * We must process exceptional notifications before
             * ordinary readability ones, or we may go straight
             * past the urgent marker.
             */
            if (rwx & SELECT_X)
                select_result(fd, SELECT_X);
            if (rwx & SELECT_R)
                select_result(fd, SELECT_R);
            if (rwx & SELECT_W)
                select_result(fd, SELECT_W);
        }

        pw_check(ctx, pw);

        bool ran_callback = run_toplevel_callbacks();

        if (!cont(ctx, found_fd, ran_callback))
            break;
    }

    pollwrap_free(pw);
    sfree(fdlist);
}